

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_4_channels_with_n_coeffs_mod2
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float *pfVar3;
  float *pfVar4;
  __m128 cs;
  __m128 c;
  __m128 tot1;
  __m128 tot0;
  float *local_4b0;
  float *hc;
  float *pfStack_4a0;
  int n;
  float *decode;
  float *output;
  float *output_end;
  float *pfStack_480;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  float *decode_buffer_local;
  uint output_sub_size_local;
  float *output_buffer_local;
  float fStack_324;
  float local_318;
  float fStack_2fc;
  float fStack_2f0;
  float fStack_2e4;
  float local_2d8;
  float fStack_2bc;
  float fStack_2b0;
  float fStack_2a4;
  float local_298;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  
  decode = output_buffer;
  pfStack_480 = horizontal_coefficients;
  horizontal_coefficients_local = (float *)horizontal_contributors;
  do {
    pfVar4 = decode_buffer + ((int)*horizontal_coefficients_local << 2);
    hc._4_4_ = ((int)horizontal_coefficients_local[1] - (int)*horizontal_coefficients_local) + -2 >>
               2;
    local_4b0 = pfStack_480;
    local_298 = (float)*(undefined8 *)pfStack_480;
    local_168 = (float)*(undefined8 *)pfVar4;
    fStack_164 = (float)((ulong)*(undefined8 *)pfVar4 >> 0x20);
    fStack_160 = (float)*(undefined8 *)(pfVar4 + 2);
    fStack_15c = (float)((ulong)*(undefined8 *)(pfVar4 + 2) >> 0x20);
    fStack_2a4 = (float)((ulong)*(undefined8 *)pfStack_480 >> 0x20);
    local_188 = (float)*(undefined8 *)(pfVar4 + 4);
    fStack_184 = (float)((ulong)*(undefined8 *)(pfVar4 + 4) >> 0x20);
    fStack_180 = (float)*(undefined8 *)(pfVar4 + 6);
    fStack_17c = (float)((ulong)*(undefined8 *)(pfVar4 + 6) >> 0x20);
    fStack_2b0 = (float)*(undefined8 *)(pfStack_480 + 2);
    local_1a8 = (float)*(undefined8 *)(pfVar4 + 8);
    fStack_1a4 = (float)((ulong)*(undefined8 *)(pfVar4 + 8) >> 0x20);
    fStack_1a0 = (float)*(undefined8 *)(pfVar4 + 10);
    fStack_19c = (float)((ulong)*(undefined8 *)(pfVar4 + 10) >> 0x20);
    tot1[2] = local_298 * local_168 + fStack_2b0 * local_1a8;
    tot1[3] = local_298 * fStack_164 + fStack_2b0 * fStack_1a4;
    tot0[0] = local_298 * fStack_160 + fStack_2b0 * fStack_1a0;
    tot0[1] = local_298 * fStack_15c + fStack_2b0 * fStack_19c;
    fStack_2bc = (float)((ulong)*(undefined8 *)(pfStack_480 + 2) >> 0x20);
    local_1c8 = (float)*(undefined8 *)(pfVar4 + 0xc);
    fStack_1c4 = (float)((ulong)*(undefined8 *)(pfVar4 + 0xc) >> 0x20);
    fStack_1c0 = (float)*(undefined8 *)(pfVar4 + 0xe);
    fStack_1bc = (float)((ulong)*(undefined8 *)(pfVar4 + 0xe) >> 0x20);
    c[2] = fStack_2a4 * local_188 + fStack_2bc * local_1c8;
    c[3] = fStack_2a4 * fStack_184 + fStack_2bc * fStack_1c4;
    tot1[0] = fStack_2a4 * fStack_180 + fStack_2bc * fStack_1c0;
    tot1[1] = fStack_2a4 * fStack_17c + fStack_2bc * fStack_1bc;
    pfVar3 = local_4b0;
    do {
      pfStack_4a0 = pfVar4;
      local_4b0 = pfVar3;
      uVar1 = *(undefined8 *)(local_4b0 + 4);
      local_2d8 = (float)uVar1;
      uVar2 = *(undefined8 *)(pfStack_4a0 + 0x10);
      local_1e8 = (float)uVar2;
      fStack_1e4 = (float)((ulong)uVar2 >> 0x20);
      fStack_1e0 = (float)*(undefined8 *)(pfStack_4a0 + 0x12);
      fStack_1dc = (float)((ulong)*(undefined8 *)(pfStack_4a0 + 0x12) >> 0x20);
      fStack_2e4 = (float)((ulong)uVar1 >> 0x20);
      local_208 = (float)*(undefined8 *)(pfStack_4a0 + 0x14);
      fStack_204 = (float)((ulong)*(undefined8 *)(pfStack_4a0 + 0x14) >> 0x20);
      fStack_200 = (float)*(undefined8 *)(pfStack_4a0 + 0x16);
      fStack_1fc = (float)((ulong)*(undefined8 *)(pfStack_4a0 + 0x16) >> 0x20);
      fStack_2f0 = (float)*(undefined8 *)(local_4b0 + 6);
      local_228 = (float)*(undefined8 *)(pfStack_4a0 + 0x18);
      fStack_224 = (float)((ulong)*(undefined8 *)(pfStack_4a0 + 0x18) >> 0x20);
      fStack_220 = (float)*(undefined8 *)(pfStack_4a0 + 0x1a);
      fStack_21c = (float)((ulong)*(undefined8 *)(pfStack_4a0 + 0x1a) >> 0x20);
      tot1[2] = tot1[2] + local_2d8 * local_1e8 + fStack_2f0 * local_228;
      tot1[3] = tot1[3] + local_2d8 * fStack_1e4 + fStack_2f0 * fStack_224;
      tot0[0] = tot0[0] + local_2d8 * fStack_1e0 + fStack_2f0 * fStack_220;
      tot0[1] = tot0[1] + local_2d8 * fStack_1dc + fStack_2f0 * fStack_21c;
      fStack_2fc = (float)((ulong)*(undefined8 *)(local_4b0 + 6) >> 0x20);
      local_248 = (float)*(undefined8 *)(pfStack_4a0 + 0x1c);
      fStack_244 = (float)((ulong)*(undefined8 *)(pfStack_4a0 + 0x1c) >> 0x20);
      fStack_240 = (float)*(undefined8 *)(pfStack_4a0 + 0x1e);
      fStack_23c = (float)((ulong)*(undefined8 *)(pfStack_4a0 + 0x1e) >> 0x20);
      c[2] = c[2] + fStack_2e4 * local_208 + fStack_2fc * local_248;
      c[3] = c[3] + fStack_2e4 * fStack_204 + fStack_2fc * fStack_244;
      tot1[0] = tot1[0] + fStack_2e4 * fStack_200 + fStack_2fc * fStack_240;
      tot1[1] = tot1[1] + fStack_2e4 * fStack_1fc + fStack_2fc * fStack_23c;
      hc._4_4_ = hc._4_4_ + -1;
      pfVar3 = local_4b0 + 4;
      pfVar4 = pfStack_4a0 + 0x10;
    } while (0 < hc._4_4_);
    local_318 = (float)*(undefined8 *)(local_4b0 + 8);
    local_268 = (float)*(undefined8 *)(pfStack_4a0 + 0x20);
    fStack_264 = (float)((ulong)*(undefined8 *)(pfStack_4a0 + 0x20) >> 0x20);
    fStack_260 = (float)*(undefined8 *)(pfStack_4a0 + 0x22);
    fStack_25c = (float)((ulong)*(undefined8 *)(pfStack_4a0 + 0x22) >> 0x20);
    fStack_324 = (float)((ulong)*(undefined8 *)(local_4b0 + 8) >> 0x20);
    local_288 = (float)*(undefined8 *)(pfStack_4a0 + 0x24);
    fStack_284 = (float)((ulong)*(undefined8 *)(pfStack_4a0 + 0x24) >> 0x20);
    fStack_280 = (float)*(undefined8 *)(pfStack_4a0 + 0x26);
    fStack_27c = (float)((ulong)*(undefined8 *)(pfStack_4a0 + 0x26) >> 0x20);
    *(ulong *)decode =
         CONCAT44(tot1[3] + local_318 * fStack_264 + c[3] + fStack_324 * fStack_284,
                  tot1[2] + local_318 * local_268 + c[2] + fStack_324 * local_288);
    *(ulong *)(decode + 2) =
         CONCAT44(tot0[1] + local_318 * fStack_25c + tot1[1] + fStack_324 * fStack_27c,
                  tot0[0] + local_318 * fStack_260 + tot1[0] + fStack_324 * fStack_280);
    pfStack_480 = pfStack_480 + coefficient_width;
    horizontal_coefficients_local = horizontal_coefficients_local + 2;
    decode = decode + 4;
  } while (decode < output_buffer + (output_sub_size << 2));
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod2 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 6 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__2_coeff_remnant( 4 );

    stbir__store_output();
  } while ( output < output_end );
}